

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O2

void * be2ne(void *s,size_t len)

{
  undefined1 uVar1;
  void *pvVar2;
  undefined1 *puVar3;
  
  pvVar2 = s;
  puVar3 = (undefined1 *)(len + (long)s);
  for (; puVar3 = puVar3 + -1, s < puVar3; s = (void *)((long)s + 1)) {
    uVar1 = *s;
    *(undefined1 *)s = *puVar3;
    *puVar3 = uVar1;
  }
  return pvVar2;
}

Assistant:

static void* be2ne(void* s, size_t len)
{
    return little_endian() ? swap_bytes(s, len) : s;
}